

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O0

void __thiscall soplex::SPxFastRT<double>::setType(SPxFastRT<double> *this,Type type)

{
  element_type *this_00;
  Type in_ESI;
  SPxRatioTester<double> *in_RDI;
  _func_int **pp_Var1;
  
  in_RDI->m_type = in_ESI;
  SPxRatioTester<double>::tolerances(in_RDI);
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2f1bb1);
  pp_Var1 = (_func_int **)Tolerances::scaleAccordingToEpsilon(this_00,1e-05);
  in_RDI[1]._vptr_SPxRatioTester = pp_Var1;
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2f1bd4);
  in_RDI[1].m_name = (char *)in_RDI->delta;
  return;
}

Assistant:

void SPxFastRT<R>::setType(typename SPxSolverBase<R>::Type type)
{
   this->m_type = type;

   minStab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_MINSTAB);
   fastDelta = this->delta;
}